

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O1

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyTableStart(VerifierTemplate<false> *this,uint8_t *table)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar5 = (long)table - (long)this->buf_;
  bVar1 = (this->opts_).check_alignment;
  if ((((uVar5 & 3) != 0 & bVar1) == 0) && (uVar5 <= this->size_ - 4 && 4 < this->size_)) {
    iVar3 = *(int *)table;
    uVar4 = (this->opts_).max_tables;
    uVar7 = this->depth_ + 1;
    this->depth_ = uVar7;
    uVar6 = this->num_tables_ + 1;
    this->num_tables_ = uVar6;
    if (((uVar7 <= (this->opts_).max_depth) &&
        (((uVar6 <= uVar4 && (uVar5 = uVar5 - (long)iVar3, ((byte)uVar5 & bVar1 & 1) == 0)) &&
         (2 < this->size_)))) && (uVar5 <= this->size_ - 2)) {
      uVar2 = *(ushort *)(this->buf_ + uVar5);
      if (((uVar2 & 1) == 0) && ((uVar2 & 1) == 0 || ((bVar1 ^ 1U) & 1) != 0)) {
        return uVar5 <= this->size_ - (ulong)uVar2 && (ulong)uVar2 < this->size_;
      }
    }
  }
  return false;
}

Assistant:

bool VerifyTableStart(const uint8_t *const table) {
    // Check the vtable offset.
    const auto tableo = static_cast<size_t>(table - buf_);
    if (!Verify<soffset_t>(tableo)) return false;
    // This offset may be signed, but doing the subtraction unsigned always
    // gives the result we want.
    const auto vtableo =
        tableo - static_cast<size_t>(ReadScalar<soffset_t>(table));
    // Check the vtable size field, then check vtable fits in its entirety.
    if (!(VerifyComplexity() && Verify<voffset_t>(vtableo) &&
          VerifyAlignment(ReadScalar<voffset_t>(buf_ + vtableo),
                          sizeof(voffset_t))))
      return false;
    const auto vsize = ReadScalar<voffset_t>(buf_ + vtableo);
    return Check((vsize & 1) == 0) && Verify(vtableo, vsize);
  }